

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall
dgPolyhedra::MarkAdjacentCoplanarFaces
          (dgPolyhedra *this,dgPolyhedra *polyhedraOut,dgEdge *face,HaF64 *pool,HaI32 strideInBytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  dgEdge *face_00;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  HaI32 HVar15;
  uint uVar16;
  dgEdge *pdVar17;
  dgEdge *pdVar18;
  ulong uVar19;
  dgEdge *pdVar20;
  dgPolyhedra *this_00;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iStack_141a4;
  int iStack_14194;
  double dStack_14178;
  double dStack_14170;
  double dStack_14168;
  dgBigVector testPoint;
  undefined1 auStack_14138 [16];
  dgTemplateVector<double> dStack_14128;
  dgBigVector testNormal;
  undefined1 auStack_140d8 [16];
  double dStack_140c8;
  dgEdge *pdStack_140c0;
  dgBigVector normal1;
  dgBigVector dStack_14098;
  dgBigVector normal;
  dgBigVector dStack_14058;
  HaI32 faceIndex [4096];
  dgEdge *deleteEdge [4096];
  dgEdge *stack [4096];
  
  deleteEdge[0] = face;
  if (face->m_incidentFace < 1) {
    __assert_fail("face->m_incidentFace > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xc36,
                  "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                 );
  }
  FaceNormal((dgBigVector *)auStack_140d8,polyhedraOut,face,pool,strideInBytes);
  dVar27 = auStack_140d8._0_8_;
  auVar21._0_8_ = dVar27 * dVar27;
  dVar9 = auStack_140d8._8_8_;
  auVar21._8_8_ = dVar9 * dVar9;
  auVar21 = vshufpd_avx(auVar21,auVar21,1);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dStack_140c8;
  auVar21 = vfmadd231sd_fma(auVar21,auStack_140d8,auStack_140d8);
  auVar21 = vfmadd231sd_fma(auVar21,auVar28,auVar28);
  if (auVar21._0_8_ <= 9.999999960041972e-13) {
    uVar16 = 1;
  }
  else {
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    dVar36 = 1.0 / auVar21._0_8_;
    stack[2] = (dgEdge *)(dVar36 * dStack_140c8);
    stack[0] = (dgEdge *)(dVar36 * dVar27);
    stack[1] = (dgEdge *)(dVar36 * dVar9);
    stack[3] = pdStack_140c0;
    dgBigVector::dgBigVector(&normal,(dgTemplateVector<double> *)stack);
    dgBigVector::dgBigVector
              (&dStack_14098,pool + (long)face->m_incidentVertex * (long)(strideInBytes >> 3));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = normal.super_dgTemplateVector<double>.m_x;
    dStack_14170 = normal.super_dgTemplateVector<double>.m_y;
    dStack_14168 = normal.super_dgTemplateVector<double>.m_x;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dStack_14098.super_dgTemplateVector<double>.m_x;
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         normal.super_dgTemplateVector<double>.m_y * dStack_14098.super_dgTemplateVector<double>.m_y
    ;
    auVar21 = vfmadd231sd_fma(auVar22,auVar29,auVar1);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = normal.super_dgTemplateVector<double>.m_z;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dStack_14098.super_dgTemplateVector<double>.m_z;
    auVar21 = vfmadd231sd_fma(auVar21,auVar30,auVar2);
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auStack_14138 = vxorpd_avx512vl(auVar21,auVar10);
    dStack_14178 = normal.super_dgTemplateVector<double>.m_z;
    IncLRU(this);
    HVar15 = IncLRU(this);
    this_00 = (dgPolyhedra *)0x0;
    pdVar17 = face;
    do {
      pdVar17->m_mark = HVar15;
      faceIndex[(long)this_00] = pdVar17->m_incidentVertex;
      if (this_00 == (dgPolyhedra *)0xfff) {
        __assert_fail("faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0]))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xc4d,
                      "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                     );
      }
      pdVar17 = pdVar17->m_next;
      this_00 = (dgPolyhedra *)((long)&(this_00->super_dgTree<dgEdge,_long>)._vptr_dgTree + 1);
    } while (pdVar17 != face);
    AddFace(polyhedraOut,(HaI32)this_00,faceIndex);
    stack[0] = face;
    uVar16 = 0;
    iStack_141a4 = 1;
    iStack_14194 = iStack_141a4;
    while (iStack_141a4 != 0) {
      pdVar17 = deleteEdge[(long)iStack_141a4 + 0xfff];
      deleteEdge[(int)uVar16] = pdVar17;
      if (0xffe < (int)uVar16) {
        __assert_fail("deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0]))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xc5a,
                      "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                     );
      }
      if (pdVar17->m_next->m_next->m_next != pdVar17) {
        __assert_fail("face->m_next->m_next->m_next == face",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xc5b,
                      "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                     );
      }
      iStack_141a4 = iStack_141a4 + -1;
      uVar16 = uVar16 + 1;
      pdVar20 = pdVar17;
      do {
        face_00 = pdVar20->m_twin;
        if ((0 < face_00->m_incidentFace) && (face_00->m_mark != HVar15)) {
          uVar19 = 0;
          pdVar18 = face_00;
          do {
            pdVar18->m_mark = HVar15;
            faceIndex[uVar19] = pdVar18->m_incidentVertex;
            if (uVar19 == 0x1000) {
              __assert_fail("faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0]))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xc67,
                            "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                           );
            }
            pdVar18 = pdVar18->m_next;
            uVar19 = uVar19 + 1;
          } while (pdVar18 != face_00);
          FaceNormal(&normal1,this_00,face_00,pool,strideInBytes);
          auVar14._8_8_ = normal1.super_dgTemplateVector<double>.m_y;
          auVar14._0_8_ = normal1.super_dgTemplateVector<double>.m_x;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = normal1.super_dgTemplateVector<double>.m_z;
          auVar31._0_8_ =
               normal1.super_dgTemplateVector<double>.m_x *
               normal1.super_dgTemplateVector<double>.m_x;
          auVar31._8_8_ =
               normal1.super_dgTemplateVector<double>.m_y *
               normal1.super_dgTemplateVector<double>.m_y;
          auVar21 = vshufpd_avx(auVar31,auVar31,1);
          auVar21 = vfmadd231sd_fma(auVar21,auVar14,auVar14);
          auVar21 = vfmadd231sd_fma(auVar21,auVar37,auVar37);
          if (9.999999960041972e-13 <= auVar21._0_8_) {
            auVar21 = vsqrtsd_avx(auVar21,auVar21);
            dVar27 = 1.0 / auVar21._0_8_;
            testPoint.super_dgTemplateVector<double>.m_z =
                 dVar27 * normal1.super_dgTemplateVector<double>.m_z;
            testPoint.super_dgTemplateVector<double>.m_x =
                 dVar27 * normal1.super_dgTemplateVector<double>.m_x;
            testPoint.super_dgTemplateVector<double>.m_y =
                 dVar27 * normal1.super_dgTemplateVector<double>.m_y;
            testPoint.super_dgTemplateVector<double>.m_w =
                 normal1.super_dgTemplateVector<double>.m_w;
            this_00 = (dgPolyhedra *)&testPoint;
            dgBigVector::dgBigVector(&testNormal,(dgTemplateVector<double> *)&testPoint);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = normal.super_dgTemplateVector<double>.m_x;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = testNormal.super_dgTemplateVector<double>.m_x;
            auVar32._8_8_ = 0;
            auVar32._0_8_ =
                 normal.super_dgTemplateVector<double>.m_y *
                 testNormal.super_dgTemplateVector<double>.m_y;
            auVar21 = vfmadd231sd_fma(auVar32,auVar23,auVar3);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = normal.super_dgTemplateVector<double>.m_z;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = testNormal.super_dgTemplateVector<double>.m_z;
            auVar21 = vfmadd132sd_fma(auVar24,auVar21,auVar4);
            if (0.9998999834060669 <= auVar21._0_8_) {
              this_00 = (dgPolyhedra *)
                        (pool + (long)face_00->m_prev->m_incidentVertex * (long)(strideInBytes >> 3)
                        );
              dgBigVector::dgBigVector(&testPoint,(HaF64 *)this_00);
              auVar13._8_8_ = testPoint.super_dgTemplateVector<double>.m_y;
              auVar13._0_8_ = testPoint.super_dgTemplateVector<double>.m_x;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = testPoint.super_dgTemplateVector<double>.m_z;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = dStack_14168;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = dStack_14170 * testPoint.super_dgTemplateVector<double>.m_y;
              auVar21 = vfmadd231sd_fma(auVar38,auVar13,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = dStack_14178;
              auVar21 = vfmadd231sd_fma(auVar21,auVar33,auVar6);
              auVar11._8_8_ = 0x7fffffffffffffff;
              auVar11._0_8_ = 0x7fffffffffffffff;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = auVar21._0_8_ + (double)auStack_14138._0_8_;
              auVar21 = vandpd_avx512vl(auVar39,auVar11);
              if (auVar21._0_8_ < 0.0078125) {
                dStack_14098.super_dgTemplateVector<double>.m_x =
                     testPoint.super_dgTemplateVector<double>.m_x +
                     dStack_14098.super_dgTemplateVector<double>.m_x;
                dStack_14098.super_dgTemplateVector<double>.m_y =
                     testPoint.super_dgTemplateVector<double>.m_y +
                     dStack_14098.super_dgTemplateVector<double>.m_y;
                iStack_14194 = iStack_14194 + 1;
                dStack_14098.super_dgTemplateVector<double>.m_z =
                     testPoint.super_dgTemplateVector<double>.m_z +
                     dStack_14098.super_dgTemplateVector<double>.m_z;
                dStack_14128.m_y = 1.0 / (double)iStack_14194;
                dStack_14128.m_z =
                     dStack_14128.m_y * dStack_14098.super_dgTemplateVector<double>.m_z;
                dStack_14128.m_x =
                     dStack_14128.m_y * dStack_14098.super_dgTemplateVector<double>.m_x;
                dStack_14128.m_y =
                     dStack_14128.m_y * dStack_14098.super_dgTemplateVector<double>.m_y;
                dStack_14128.m_w = dStack_14098.super_dgTemplateVector<double>.m_w;
                dgBigVector::dgBigVector(&dStack_14058,&dStack_14128);
                testPoint.super_dgTemplateVector<double>.m_x =
                     dStack_14058.super_dgTemplateVector<double>.m_x;
                testPoint.super_dgTemplateVector<double>.m_y =
                     dStack_14058.super_dgTemplateVector<double>.m_y;
                testPoint.super_dgTemplateVector<double>.m_z =
                     dStack_14058.super_dgTemplateVector<double>.m_z;
                testPoint.super_dgTemplateVector<double>.m_w =
                     dStack_14058.super_dgTemplateVector<double>.m_w;
                auStack_140d8._0_8_ =
                     normal1.super_dgTemplateVector<double>.m_x + (double)auStack_140d8._0_8_;
                auStack_140d8._8_8_ =
                     normal1.super_dgTemplateVector<double>.m_y + (double)auStack_140d8._8_8_;
                auVar40._0_8_ = (double)auStack_140d8._0_8_ * (double)auStack_140d8._0_8_;
                auVar40._8_8_ = (double)auStack_140d8._8_8_ * (double)auStack_140d8._8_8_;
                dStack_140c8 = normal1.super_dgTemplateVector<double>.m_z + dStack_140c8;
                auVar21 = vshufpd_avx(auVar40,auVar40,1);
                auVar21 = vfmadd231sd_fma(auVar21,auStack_140d8,auStack_140d8);
                auVar34._8_8_ = 0;
                auVar34._0_8_ = dStack_140c8;
                auVar21 = vfmadd231sd_fma(auVar21,auVar34,auVar34);
                auVar21 = vsqrtsd_avx(auVar21,auVar21);
                dStack_14128.m_y = 1.0 / auVar21._0_8_;
                dStack_14128.m_z = dStack_14128.m_y * dStack_140c8;
                dStack_14128.m_x = dStack_14128.m_y * (double)auStack_140d8._0_8_;
                dStack_14128.m_y = dStack_14128.m_y * (double)auStack_140d8._8_8_;
                dStack_14128.m_w = (double)pdStack_140c0;
                dgBigVector::dgBigVector(&dStack_14058,&dStack_14128);
                this_00 = (dgPolyhedra *)(uVar19 & 0xffffffff);
                testNormal.super_dgTemplateVector<double>.m_x =
                     dStack_14058.super_dgTemplateVector<double>.m_x;
                testNormal.super_dgTemplateVector<double>.m_y =
                     dStack_14058.super_dgTemplateVector<double>.m_y;
                testNormal.super_dgTemplateVector<double>.m_z =
                     dStack_14058.super_dgTemplateVector<double>.m_z;
                testNormal.super_dgTemplateVector<double>.m_w =
                     dStack_14058.super_dgTemplateVector<double>.m_w;
                auVar25._8_8_ = 0;
                auVar25._0_8_ = dStack_14058.super_dgTemplateVector<double>.m_x;
                dStack_14170 = dStack_14058.super_dgTemplateVector<double>.m_y;
                dStack_14168 = dStack_14058.super_dgTemplateVector<double>.m_x;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = testPoint.super_dgTemplateVector<double>.m_x;
                auVar35._8_8_ = 0;
                auVar35._0_8_ =
                     dStack_14058.super_dgTemplateVector<double>.m_y *
                     testPoint.super_dgTemplateVector<double>.m_y;
                auVar21 = vfmadd231sd_fma(auVar35,auVar25,auVar7);
                auVar26._8_8_ = 0;
                auVar26._0_8_ = dStack_14058.super_dgTemplateVector<double>.m_z;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = testPoint.super_dgTemplateVector<double>.m_z;
                auVar21 = vfmadd231sd_fma(auVar21,auVar26,auVar8);
                dStack_14178 = dStack_14058.super_dgTemplateVector<double>.m_z;
                AddFace(polyhedraOut,(HaI32)uVar19,faceIndex);
                stack[iStack_141a4] = face_00;
                if (0xffe < iStack_141a4) {
                  __assert_fail("index < hacd::HaI32 (sizeof (stack) / sizeof (stack[0]))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                ,0xc86,
                                "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                               );
                }
                iStack_141a4 = iStack_141a4 + 1;
                auVar12._8_8_ = 0x8000000000000000;
                auVar12._0_8_ = 0x8000000000000000;
                auStack_14138 = vxorpd_avx512vl(auVar21,auVar12);
              }
            }
          }
          else {
            deleteEdge[(int)uVar16] = face_00;
            if (0xffe < (int)uVar16) {
              __assert_fail("deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0]))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xc71,
                            "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                           );
            }
            uVar16 = uVar16 + 1;
          }
        }
        pdVar20 = pdVar20->m_next;
      } while (pdVar20 != pdVar17);
    }
    EndFace(polyhedraOut);
  }
  for (uVar19 = 0; (~((int)uVar16 >> 0x1f) & uVar16) != uVar19; uVar19 = uVar19 + 1) {
    DeleteFace(this,deleteEdge[uVar19]);
  }
  return;
}

Assistant:

void dgPolyhedra::MarkAdjacentCoplanarFaces (dgPolyhedra& polyhedraOut, dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 strideInBytes)
{
	const hacd::HaF64 normalDeviation = hacd::HaF64 (0.9999f);
	const hacd::HaF64 distanceFromPlane = hacd::HaF64 (1.0f / 128.0f);

	hacd::HaI32 faceIndex[1024 * 4];
	dgEdge* stack[1024 * 4];
	dgEdge* deleteEdge[1024 * 4];

	hacd::HaI32 deleteCount = 1;
	deleteEdge[0] = face;
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	HACD_ASSERT (face->m_incidentFace > 0);

	dgBigVector normalAverage (FaceNormal (face, pool, strideInBytes));
	hacd::HaF64 dot = normalAverage % normalAverage;
	if (dot > hacd::HaF64 (1.0e-12f)) {
		hacd::HaI32 testPointsCount = 1;
		dot = hacd::HaF64 (1.0f) / sqrt (dot);
		dgBigVector normal (normalAverage.Scale (dot));

		dgBigVector averageTestPoint (&pool[face->m_incidentVertex * stride]);
		dgBigPlane testPlane(normal, - (averageTestPoint % normal));

		polyhedraOut.BeginFace();

		IncLRU();
		hacd::HaI32 faceMark = IncLRU();

		hacd::HaI32 faceIndexCount = 0;
		dgEdge* ptr = face;
		do {
			ptr->m_mark = faceMark;
			faceIndex[faceIndexCount] = ptr->m_incidentVertex;
			faceIndexCount ++;
			HACD_ASSERT (faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0])));
			ptr = ptr ->m_next;
		} while (ptr != face);
		polyhedraOut.AddFace(faceIndexCount, faceIndex);

		hacd::HaI32 index = 1;
		deleteCount = 0;
		stack[0] = face;
		while (index) {
			index --;
			dgEdge* const face = stack[index];
			deleteEdge[deleteCount] = face;
			deleteCount ++;
			HACD_ASSERT (deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0])));
			HACD_ASSERT (face->m_next->m_next->m_next == face);

			dgEdge* edge = face;
			do {
				dgEdge* const ptr = edge->m_twin;
				if (ptr->m_incidentFace > 0) {
					if (ptr->m_mark != faceMark) {
						dgEdge* ptr1 = ptr;
						faceIndexCount = 0;
						do {
							ptr1->m_mark = faceMark;
							faceIndex[faceIndexCount] = ptr1->m_incidentVertex;
							HACD_ASSERT (faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0])));
							faceIndexCount ++;
							ptr1 = ptr1 ->m_next;
						} while (ptr1 != ptr);

						dgBigVector normal1 (FaceNormal (ptr, pool, strideInBytes));
						dot = normal1 % normal1;
						if (dot < hacd::HaF64 (1.0e-12f)) {
							deleteEdge[deleteCount] = ptr;
							deleteCount ++;
							HACD_ASSERT (deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0])));
						} else {
							//normal1 = normal1.Scale (hacd::HaF64 (1.0f) / sqrt (dot));
							dgBigVector testNormal (normal1.Scale (hacd::HaF64 (1.0f) / sqrt (dot)));
							dot = normal % testNormal;
							if (dot >= normalDeviation) {
								dgBigVector testPoint (&pool[ptr->m_prev->m_incidentVertex * stride]);
								hacd::HaF64 dist = fabs (testPlane.Evalue (testPoint));
								if (dist < distanceFromPlane) {
									testPointsCount ++;

									averageTestPoint += testPoint;
									testPoint = averageTestPoint.Scale (hacd::HaF64 (1.0f) / hacd::HaF64(testPointsCount));

									normalAverage += normal1;
									testNormal = normalAverage.Scale (hacd::HaF64 (1.0f) / sqrt (normalAverage % normalAverage));
									testPlane = dgBigPlane (testNormal, - (testPoint % testNormal));

									polyhedraOut.AddFace(faceIndexCount, faceIndex);;
									stack[index] = ptr;
									index ++;
									HACD_ASSERT (index < hacd::HaI32 (sizeof (stack) / sizeof (stack[0])));
								}
							}
						}
					}
				}

				edge = edge->m_next;
			} while (edge != face);
		}
		polyhedraOut.EndFace();
	}

	for (hacd::HaI32 index = 0; index < deleteCount; index ++) {
		DeleteFace (deleteEdge[index]);
	}
}